

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int fits_quantize_float(long row,float *fdata,long nxpix,long nypix,int nullcheck,
                       float in_null_value,float qlevel,int dither_method,int *idata,double *bscale,
                       double *bzero,int *iminval,int *imaxval)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  long lVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  float *pfVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  undefined8 in_XMM8_Qb;
  double dVar25;
  float minval;
  float maxval;
  float local_88;
  int local_84;
  long ngood;
  double local_78;
  undefined8 uStack_70;
  float local_68;
  double local_58;
  double noise5;
  double noise3;
  double noise2;
  int status;
  
  ngood = 0;
  minval = 0.0;
  maxval = 0.0;
  lVar15 = nypix * nxpix;
  if (lVar15 < 2) {
    iVar11 = 0;
    dVar25 = 0.0;
    local_78 = 1.0;
LAB_001af355:
    *bscale = local_78;
    *bzero = dVar25;
  }
  else {
    local_88 = in_null_value;
    if (0.0 <= qlevel) {
      local_58 = (double)qlevel;
      local_84 = dither_method;
      local_78 = (double)row;
      local_68 = qlevel;
      FnNoise5_float(fdata,nxpix,nypix,nullcheck,in_null_value,&ngood,&minval,&maxval,&noise2,
                     &noise3,&noise5,&status);
      if (ngood == 0 && nullcheck != 0) {
        minval = 0.0;
        maxval = 1.0;
        noise2 = 1.0;
      }
      else {
        if (noise3 <= noise2 || noise2 == 0.0) {
          noise2 = noise3;
        }
        if (((noise5 != 0.0) || (NAN(noise5))) && (noise5 < noise2)) {
          noise2 = noise5;
        }
      }
      in_XMM8_Qb = 0;
      dVar25 = noise2 / local_58;
      if ((local_68 == 0.0) && (!NAN(local_68))) {
        dVar25 = noise2 * 0.25;
      }
      row = (long)local_78;
      dither_method = local_84;
      if ((dVar25 != 0.0) || (NAN(dVar25))) goto LAB_001aef7e;
    }
    else {
      lVar6 = 1;
      lVar3 = lVar6;
      if (nxpix < 5) {
        lVar3 = nypix;
      }
      lVar3 = lVar3 * nxpix;
      dVar25 = (double)-qlevel;
      if (lVar3 < 5) {
        lVar6 = 0;
        if (lVar3 < 1) {
          lVar3 = lVar6;
        }
        minval = 3.4028235e+38;
        ngood = 0;
        maxval = -3.4028235e+38;
        for (; lVar3 != lVar6; lVar6 = lVar6 + 1) {
          fVar20 = fdata[lVar6];
          if (nullcheck == 0) {
LAB_001aec37:
            fVar23 = fVar20;
            if (minval <= fVar20) {
              fVar23 = minval;
            }
            fVar19 = fVar20;
            if (fVar20 <= maxval) {
              fVar19 = maxval;
            }
            ngood = ngood + 1;
            minval = fVar23;
          }
          else if ((fVar20 != in_null_value) || (fVar19 = maxval, NAN(fVar20) || NAN(in_null_value))
                  ) goto LAB_001aec37;
          maxval = fVar19;
        }
      }
      else {
        lVar9 = 0;
        if (nypix < 1) {
          nypix = lVar9;
        }
        if (nxpix < 5) {
          nypix = lVar6;
        }
        minval = 3.4028235e+38;
        ngood = 0;
        pfVar10 = fdata;
        maxval = -3.4028235e+38;
        for (; lVar9 != nypix; lVar9 = lVar9 + 1) {
          pfVar1 = fdata + lVar9 * lVar3;
          if (nullcheck == 0) {
            fVar20 = *pfVar1;
            lVar12 = lVar6;
          }
          else {
            lVar12 = 0;
            do {
              fVar20 = maxval;
              if (lVar3 - lVar12 == 0) goto LAB_001aeea7;
              fVar20 = pfVar10[lVar12];
              lVar12 = lVar12 + 1;
            } while ((fVar20 == in_null_value) && (!NAN(fVar20) && !NAN(in_null_value)));
          }
          lVar13 = lVar12;
          if (nullcheck != 0) {
            lVar14 = lVar12;
            if (lVar3 - lVar12 != 0 && lVar12 <= lVar3) {
              lVar14 = lVar3;
            }
            for (; lVar13 = lVar14, lVar12 < lVar3; lVar12 = lVar12 + 1) {
              lVar13 = lVar12;
              if ((pfVar10[lVar12] != in_null_value) || (NAN(pfVar10[lVar12]) || NAN(in_null_value))
                 ) break;
            }
          }
          fVar19 = fVar20;
          if (minval <= fVar20) {
            fVar19 = minval;
          }
          if (fVar20 <= maxval) {
            fVar20 = maxval;
          }
          minval = fVar19;
          if (lVar13 != lVar3) {
            lVar12 = lVar13 + 1;
            lVar14 = lVar12;
            if (nullcheck != 0) {
              lVar16 = lVar12;
              if (lVar3 - lVar12 != 0 && lVar12 <= lVar3) {
                lVar16 = lVar3;
              }
              for (; lVar14 = lVar16, lVar12 < lVar3; lVar12 = lVar12 + 1) {
                lVar14 = lVar12;
                if ((pfVar10[lVar12] != in_null_value) ||
                   (NAN(pfVar10[lVar12]) || NAN(in_null_value))) break;
              }
            }
            fVar23 = pfVar1[lVar13];
            fVar22 = fVar23;
            if (fVar19 <= fVar23) {
              fVar22 = fVar19;
            }
            if (fVar23 <= fVar20) {
              fVar23 = fVar20;
            }
            fVar20 = fVar23;
            minval = fVar22;
            if (lVar14 != lVar3) {
              lVar12 = lVar14 + 1;
              lVar13 = lVar12;
              if (nullcheck != 0) {
                lVar16 = lVar12;
                if (lVar3 - lVar12 != 0 && lVar12 <= lVar3) {
                  lVar16 = lVar3;
                }
                for (; lVar13 = lVar16, lVar12 < lVar3; lVar12 = lVar12 + 1) {
                  lVar13 = lVar12;
                  if ((pfVar10[lVar12] != in_null_value) ||
                     (NAN(pfVar10[lVar12]) || NAN(in_null_value))) break;
                }
              }
              fVar20 = pfVar1[lVar14];
              minval = fVar20;
              if (fVar22 <= fVar20) {
                minval = fVar22;
              }
              if (fVar20 <= fVar23) {
                fVar20 = fVar23;
              }
              if (lVar13 != lVar3) {
                fVar19 = pfVar1[lVar13];
                fVar23 = fVar19;
                if (minval <= fVar19) {
                  fVar23 = minval;
                }
                if (fVar19 <= fVar20) {
                  fVar19 = fVar20;
                }
                while (lVar12 = lVar13 + 1, lVar12 < lVar3) {
                  if (nullcheck == 0) {
                    fVar20 = pfVar1[lVar13 + 1];
                    lVar13 = lVar12;
                  }
                  else {
                    while( true ) {
                      if (lVar3 <= lVar12) goto LAB_001aeea3;
                      fVar20 = pfVar10[lVar12];
                      lVar13 = lVar12;
                      if ((fVar20 != in_null_value) || (NAN(fVar20) || NAN(in_null_value))) break;
                      lVar12 = lVar12 + 1;
                    }
                  }
                  fVar22 = fVar20;
                  if (fVar23 <= fVar20) {
                    fVar22 = fVar23;
                  }
                  if (fVar20 <= fVar19) {
                    fVar20 = fVar19;
                  }
                  ngood = ngood + 1;
                  fVar19 = fVar20;
                  fVar23 = fVar22;
                }
LAB_001aeea3:
                ngood = ngood + 4;
                fVar20 = fVar19;
                minval = fVar23;
              }
            }
          }
LAB_001aeea7:
          pfVar10 = pfVar10 + lVar3;
          maxval = fVar20;
        }
      }
LAB_001aef7e:
      local_78 = dVar25;
      if ((double)(maxval - minval) / local_78 <= 4294967284.0) {
        if (row < 1) {
          uVar8 = 0;
          uVar7 = 0;
        }
        else {
          if ((fits_rand_value == (float *)0x0) &&
             (uStack_70 = in_XMM8_Qb, iVar11 = fits_init_randoms(), iVar11 != 0)) {
            return 0x71;
          }
          uVar8 = (row - 1U) % 10000;
          uVar7 = (ulong)(uint)(int)(fits_rand_value[uVar8] * 500.0);
        }
        pfVar10 = fits_rand_value;
        if (ngood == lVar15) {
          if (dither_method == 2) {
            dVar25 = local_78 * 2147483637.0 + (double)minval;
          }
          else if (2147483637.0 <= (double)(maxval - minval) / local_78) {
            dVar25 = (double)(maxval + minval) * 0.5;
          }
          else {
            dVar25 = (double)(long)((double)minval / local_78 + 0.5) * local_78;
          }
          if (row < 1) {
            for (uVar7 = 0; lVar15 - uVar7 != 0; uVar7 = uVar7 + 1) {
              dVar24 = ((double)fdata[uVar7] - dVar25) / local_78;
              idata[uVar7] = (int)(dVar24 + *(double *)(&DAT_001d84c0 + (ulong)(dVar24 < 0.0) * 8));
            }
          }
          else {
            for (lVar6 = 0; lVar15 - lVar6 != 0; lVar6 = lVar6 + 1) {
              fVar20 = fdata[lVar6];
              if (dither_method == 2) {
                iVar11 = -0x7ffffffe;
                if ((fVar20 != 0.0) || (NAN(fVar20))) goto LAB_001af229;
              }
              else {
LAB_001af229:
                dVar24 = (double)pfVar10[(int)uVar7] + ((double)fVar20 - dVar25) / local_78 + -0.5;
                iVar11 = (int)(dVar24 + *(double *)(&DAT_001d84c0 + (ulong)(dVar24 < 0.0) * 8));
              }
              idata[lVar6] = iVar11;
              uVar4 = (int)uVar7 + 1;
              if (uVar4 == 10000) {
                uVar4 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar4;
                if (uVar4 == 10000) {
                  uVar8 = 0;
                }
                uVar4 = (uint)(pfVar10[(int)uVar8] * 500.0);
              }
              uVar7 = (ulong)uVar4;
            }
          }
        }
        else {
          dVar25 = local_78 * 2147483637.0 + (double)minval;
          if (row < 1) {
            for (uVar7 = 0; lVar15 - uVar7 != 0; uVar7 = uVar7 + 1) {
              fVar20 = fdata[uVar7];
              if ((fVar20 != local_88) || (NAN(fVar20) || NAN(local_88))) {
                dVar24 = ((double)fVar20 - dVar25) / local_78;
                iVar11 = (int)(dVar24 + *(double *)(&DAT_001d84c0 + (ulong)(dVar24 < 0.0) * 8));
              }
              else {
                iVar11 = -0x7fffffff;
              }
              idata[uVar7] = iVar11;
            }
          }
          else {
            for (lVar6 = 0; lVar15 - lVar6 != 0; lVar6 = lVar6 + 1) {
              fVar20 = fdata[lVar6];
              if ((fVar20 != local_88) || (NAN(fVar20) || NAN(local_88))) {
                if (dither_method == 2) {
                  iVar11 = -0x7ffffffe;
                  if ((fVar20 == 0.0) && (!NAN(fVar20))) goto LAB_001af0cb;
                }
                dVar24 = (double)pfVar10[(int)uVar7] + ((double)fVar20 - dVar25) / local_78 + -0.5;
                iVar11 = (int)(dVar24 + *(double *)(&DAT_001d84c0 + (ulong)(dVar24 < 0.0) * 8));
              }
              else {
                iVar11 = -0x7fffffff;
              }
LAB_001af0cb:
              idata[lVar6] = iVar11;
              uVar4 = (int)uVar7 + 1;
              if (uVar4 == 10000) {
                uVar4 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar4;
                if (uVar4 == 10000) {
                  uVar8 = 0;
                }
                uVar4 = (uint)(pfVar10[(int)uVar8] * 500.0);
              }
              uVar7 = (ulong)uVar4;
            }
          }
        }
        auVar17._0_8_ = (double)maxval - dVar25;
        auVar17._8_8_ = (double)minval - dVar25;
        auVar18._8_4_ = SUB84(local_78,0);
        auVar18._0_8_ = local_78;
        auVar18._12_4_ = (int)((ulong)local_78 >> 0x20);
        auVar18 = divpd(auVar17,auVar18);
        lVar15 = -(ulong)(auVar18._8_8_ < 0.0);
        auVar2._8_4_ = (int)lVar15;
        auVar2._0_8_ = -(ulong)(auVar18._0_8_ < 0.0);
        auVar2._12_4_ = (int)((ulong)lVar15 >> 0x20);
        uVar5 = movmskpd((int)uVar7,auVar2);
        uVar21 = 0xbfe00000;
        uVar4 = uVar21;
        if ((uVar5 & 2) == 0) {
          uVar4 = 0x3fe00000;
        }
        *iminval = (int)(auVar18._8_8_ + (double)((ulong)uVar4 << 0x20));
        if ((uVar5 & 1) == 0) {
          uVar21 = 0x3fe00000;
        }
        *imaxval = (int)(auVar18._0_8_ + (double)((ulong)uVar21 << 0x20));
        iVar11 = 1;
        goto LAB_001af355;
      }
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int fits_quantize_float (long row, float fdata[], long nxpix, long nypix, int nullcheck, 
	float in_null_value, float qlevel, int dither_method, int idata[], double *bscale,
	double *bzero, int *iminval, int *imaxval) {

/* arguments:
long row            i: if positive, used to calculate random dithering seed value
                       (this is only used when dithering the quantized values)
float fdata[]       i: array of image pixels to be compressed
long nxpix          i: number of pixels in each row of fdata
long nypix          i: number of rows in fdata
nullcheck           i: check for nullvalues in fdata?
float in_null_value i: value used to represent undefined pixels in fdata
float qlevel        i: quantization level
int dither_method   i; which dithering method to use
int idata[]         o: values of fdata after applying bzero and bscale
double bscale       o: scale factor
double bzero        o: zero offset
int iminval         o: minimum quantized value that is returned
int imaxval         o: maximum quantized value that is returned

The function value will be one if the input fdata were copied to idata;
in this case the parameters bscale and bzero can be used to convert back to
nearly the original floating point values:  fdata ~= idata * bscale + bzero.
If the function value is zero, the data were not copied to idata.
*/

	int status, iseed = 0;
	long i, nx, ngood = 0;
	double stdev, noise2, noise3, noise5;	/* MAD 2nd, 3rd, and 5th order noise values */
	float minval = 0., maxval = 0.;  /* min & max of fdata */
	double delta;		/* bscale, 1 in idata = delta in fdata */
	double zeropt;	        /* bzero */
	double temp;
        int nextrand = 0;
	extern float *fits_rand_value; /* this is defined in imcompress.c */
	LONGLONG iqfactor;

	nx = nxpix * nypix;
	if (nx <= 1) {
	    *bscale = 1.;
	    *bzero  = 0.;
	    return (0);
	}

        if (qlevel >= 0.) {

	    /* estimate background noise using MAD pixel differences */
	    FnNoise5_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, &noise2, &noise3, &noise5, &status);      

	    if (nullcheck && ngood == 0) {   /* special case of an image filled with Nulls */
	        /* set parameters to dummy values, which are not used */
		minval = 0.;
		maxval = 1.;
		stdev = 1;
	    } else {

	        /* use the minimum of noise2, noise3, and noise5 as the best noise value */
	        stdev = noise3;
	        if (noise2 != 0. && noise2 < stdev) stdev = noise2;
	        if (noise5 != 0. && noise5 < stdev) stdev = noise5;
            }

	    if (qlevel == 0.)
	        delta = stdev / 4.;  /* default quantization */
	    else
	        delta = stdev / qlevel;

	    if (delta == 0.) 
	        return (0);			/* don't quantize */

	} else {
	    /* negative value represents the absolute quantization level */
	    delta = -qlevel;

	    /* only nned to calculate the min and max values */
	    FnNoise3_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, 0, &status);      
 	}

        /* check that the range of quantized levels is not > range of int */
	if ((maxval - minval) / delta > 2. * 2147483647. - N_RESERVED_VALUES )
	    return (0);			/* don't quantize */

        if (row > 0) { /* we need to dither the quantized values */
            if (!fits_rand_value) 
	        if (fits_init_randoms()) return(MEMORY_ALLOCATION);

	    /* initialize the index to the next random number in the list */
            iseed = (int) ((row - 1) % N_RANDOM);
	    nextrand = (int) (fits_rand_value[iseed] * 500.);
	}

        if (ngood == nx) {   /* don't have to check for nulls */
            /* return all positive values, if possible since some */
            /* compression algorithms either only work for positive integers, */
            /* or are more efficient.  */

            if (dither_method == SUBTRACTIVE_DITHER_2)
	    {
                /* shift the range to be close to the value used to represent zeros */
                zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);
            }
	    else if ((maxval - minval) / delta < 2147483647. - N_RESERVED_VALUES )
            {
                zeropt = minval;
		/* fudge the zero point so it is an integer multiple of delta */
		/* This helps to ensure the same scaling will be performed if the */
		/* file undergoes multiple fpack/funpack cycles */
		iqfactor = (LONGLONG) (zeropt/delta  + 0.5);
		zeropt = iqfactor * delta;               
            }
            else
            {
                /* center the quantized levels around zero */
                zeropt = (minval + maxval) / 2.;
            }

            if (row > 0) {  /* dither the values when quantizing */
              for (i = 0;  i < nx;  i++) {
	    
		if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		   idata[i] = ZERO_VALUE;
		} else {
		   idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		}

                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */

       	        for (i = 0;  i < nx;  i++) {
	            idata[i] = NINT ((fdata[i] - zeropt) / delta);
                }
            } 
        }
        else {
            /* data contains null values; shift the range to be */
            /* close to the value used to represent null values */
            zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);

            if (row > 0) {  /* dither the values */
	      for (i = 0;  i < nx;  i++) {
                if (fdata[i] != in_null_value) {
		    if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		       idata[i] = ZERO_VALUE;
		    } else {
		       idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		    }
                } else {
                    idata[i] = NULL_VALUE;
                }

                /* increment the random number index, regardless */
                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */
	       for (i = 0;  i < nx;  i++) {
 
                 if (fdata[i] != in_null_value) {
		    idata[i] =  NINT((fdata[i] - zeropt) / delta);
                 } else { 
                    idata[i] = NULL_VALUE;
                 }
               }
            }
	}

        /* calc min and max values */
        temp = (minval - zeropt) / delta;
        *iminval =  NINT (temp);
        temp = (maxval - zeropt) / delta;
        *imaxval =  NINT (temp);

	*bscale = delta;
	*bzero = zeropt;
	return (1);			/* yes, data have been quantized */
}